

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ecf33::DirectoryTreeSignatureTask::inputsAvailable
          (DirectoryTreeSignatureTask *this,TaskInterface ti)

{
  bool bVar1;
  iterator first;
  iterator last;
  size_t sig;
  CommandSignature local_150;
  BuildValue local_148;
  ValueType local_d8;
  unsigned_long local_c0;
  size_t local_b8;
  uchar *local_b0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a8;
  hash_code local_a0;
  size_t local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  hash_code local_78;
  size_t local_70;
  reference local_68;
  SubpathInfo *info;
  iterator __end2;
  iterator __begin2;
  vector<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
  *__range2;
  hash_code local_38;
  size_t local_30;
  hash_code local_28;
  hash_code code;
  DirectoryTreeSignatureTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (DirectoryTreeSignatureTask *)ti.impl;
  code.value = (size_t)this;
  local_28 = llvm::hash_value<char>(&this->path);
  first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->directoryValue);
  last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->directoryValue);
  local_38 = llvm::
             hash_combine_range<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                       ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )first._M_current,
                        (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )last._M_current);
  local_30 = (size_t)llvm::hash_combine<llvm::hash_code,llvm::hash_code>(&local_28,&local_38);
  local_28 = (hash_code)local_30;
  __end2 = std::
           vector<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
           ::begin(&this->childResults);
  info = (SubpathInfo *)
         std::
         vector<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
         ::end(&this->childResults);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo_*,_std::vector<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>_>
                                *)&info);
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo_*,_std::vector<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>_>
               ::operator*(&__end2);
    local_80._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            (&local_68->value);
    data = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&local_68->value);
    local_78 = llvm::
               hash_combine_range<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                         (local_80,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    )data);
    local_70 = (size_t)llvm::hash_combine<llvm::hash_code,llvm::hash_code>(&local_28,&local_78);
    local_28 = (hash_code)local_70;
    bVar1 = llvm::Optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::hasValue
                      (&local_68->directorySignatureValue);
    if (bVar1) {
      local_90 = llvm::Optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                 getValue(&local_68->directorySignatureValue);
      local_a8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(local_90);
      local_b0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(local_90);
      local_a0 = llvm::
                 hash_combine_range<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           (local_a8,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      )local_b0);
      local_98 = (size_t)llvm::hash_combine<llvm::hash_code,llvm::hash_code>(&local_28,&local_a0);
      local_28 = (hash_code)local_98;
    }
    else {
      local_c0 = 0xc183979c3e98722e;
      local_b8 = (size_t)llvm::hash_combine<llvm::hash_code,unsigned_long>(&local_28,&local_c0);
      local_28 = (hash_code)local_b8;
    }
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo_*,_std::vector<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>_>
    ::operator++(&__end2);
  }
  sig = llvm::hash_code::operator_cast_to_unsigned_long(&local_28);
  llbuild::basic::CommandSignature::CommandSignature(&local_150,sig);
  llbuild::buildsystem::BuildValue::makeDirectoryTreeSignature(&local_148,local_150);
  llbuild::buildsystem::BuildValue::toData(&local_d8,&local_148);
  llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_d8,false);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_d8);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_148);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // Compute the signature across all of the inputs.
    using llvm::hash_combine;
    llvm::hash_code code = hash_value(path);

    // Add the signature for the actual input path.
    code = hash_combine(
        code, hash_combine_range(directoryValue.begin(), directoryValue.end()));

    // For now, we represent this task as the aggregation of all the inputs.
    for (const auto& info: childResults) {
      // We merge the children by simply combining their encoded representation.
      code = hash_combine(
          code, hash_combine_range(info.value.begin(), info.value.end()));
      if (info.directorySignatureValue.hasValue()) {
        auto& data = info.directorySignatureValue.getValue();
        code = hash_combine(
            code, hash_combine_range(data.begin(), data.end()));
      } else {
        // Combine a random number to represent nil.
        code = hash_combine(code, 0XC183979C3E98722E);
      }
    }

    // Compute the signature.
    ti.complete(BuildValue::makeDirectoryTreeSignature(
                  CommandSignature(uint64_t(code))).toData());
  }